

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O1

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::ConvertAesRequest,cfd::js::api::json::ConvertAesResponse,cfd::js::api::ConvertAesRequestStruct,cfd::js::api::ConvertAesResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::ConvertAesResponseStruct_(const_cfd::js::api::ConvertAesRequestStruct_&)>
          *call_function)

{
  json *pjVar1;
  undefined8 uVar2;
  ConvertAesResponseStruct response;
  ConvertAesRequestStruct request;
  ConvertAesResponse res;
  ConvertAesRequest req;
  string local_338;
  ConvertAesResponseStruct local_318;
  ConvertAesRequestStruct local_250;
  ErrorResponse local_198;
  ConvertAesRequest local_e0;
  
  ConvertAesRequest::ConvertAesRequest(&local_e0);
  core::JsonClassBase<cfd::js::api::json::ConvertAesRequest>::Deserialize
            (&local_e0.super_JsonClassBase<cfd::js::api::json::ConvertAesRequest>,(string *)this);
  ConvertAesRequest::ConvertToStruct(&local_250,&local_e0);
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(&local_318,request_message,&local_250);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_318.error.code == 0) {
      ConvertAesResponse::ConvertAesResponse((ConvertAesResponse *)&local_198);
      ConvertAesResponse::ConvertFromStruct((ConvertAesResponse *)&local_198,&local_318);
      core::JsonClassBase<cfd::js::api::json::ConvertAesResponse>::Serialize_abi_cxx11_
                (&local_338,(JsonClassBase<cfd::js::api::json::ConvertAesResponse> *)&local_198);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_338);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p);
      }
      ConvertAesResponse::~ConvertAesResponse((ConvertAesResponse *)&local_198);
    }
    else {
      ErrorResponse::ConvertFromStruct(&local_198,&local_318.error);
      core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
                (&local_338,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&local_198);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_338);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p);
      }
      local_198.super_ErrorResponseBase.super_JsonClassBase<cfd::js::api::json::ErrorResponseBase>.
      _vptr_JsonClassBase = (_func_int **)&PTR__ErrorResponseBase_00a85a68;
      InnerErrorResponse::~InnerErrorResponse(&local_198.super_ErrorResponseBase.error_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_198.super_ErrorResponseBase.ignore_items._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_318.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_318.error.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318.error.message._M_dataplus._M_p != &local_318.error.message.field_2) {
      operator_delete(local_318.error.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318.error.type._M_dataplus._M_p != &local_318.error.type.field_2) {
      operator_delete(local_318.error.type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318.hex._M_dataplus._M_p != &local_318.hex.field_2) {
      operator_delete(local_318.hex._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_250.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.data._M_dataplus._M_p != &local_250.data.field_2) {
      operator_delete(local_250.data._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.iv._M_dataplus._M_p != &local_250.iv.field_2) {
      operator_delete(local_250.iv._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.key._M_dataplus._M_p != &local_250.key.field_2) {
      operator_delete(local_250.key._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.mode._M_dataplus._M_p != &local_250.mode.field_2) {
      operator_delete(local_250.mode._M_dataplus._M_p);
    }
    ConvertAesRequest::~ConvertAesRequest(&local_e0);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_bad_function_call();
  ConvertAesResponse::~ConvertAesResponse((ConvertAesResponse *)&local_198);
  pjVar1 = (json *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (pjVar1 != this) {
    operator_delete(pjVar1);
  }
  ConvertAesResponseStruct::~ConvertAesResponseStruct(&local_318);
  ConvertAesRequestStruct::~ConvertAesRequestStruct(&local_250);
  ConvertAesRequest::~ConvertAesRequest(&local_e0);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}